

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownGenericExpression
          (FilterCombiner *this,LogicalGet *get,Expression *expr)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  vector<duckdb::ColumnIndex,_true> *this_00;
  const_reference col_idx;
  FilterPushdownResult FVar4;
  ulong __n;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_70;
  TableFilter *local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  vector<duckdb::ColumnBinding,_true> bindings;
  
  if ((get->function).pushdown_expression == (table_function_pushdown_expression_t)0x0) {
    FVar4 = NO_PUSHDOWN;
  }
  else {
    bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ColumnLifetimeAnalyzer::ExtractColumnBindings(expr,&bindings);
    if (bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start ==
        bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_012580a8:
      FVar4 = NO_PUSHDOWN;
    }
    else {
      __n = 1;
      FVar4 = NO_PUSHDOWN;
      while (__n < (ulong)((long)bindings.
                                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 .
                                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)bindings.
                                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 .
                                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        pvVar2 = vector<duckdb::ColumnBinding,_true>::get<true>(&bindings,__n);
        pvVar3 = vector<duckdb::ColumnBinding,_true>::get<true>(&bindings,0);
        if ((pvVar2->table_index != pvVar3->table_index) ||
           (__n = __n + 1, pvVar2->column_index != pvVar3->column_index)) goto LAB_012580aa;
      }
      bVar1 = (*(get->function).pushdown_expression)(this->context,get,expr);
      if (!bVar1) goto LAB_012580a8;
      (*(expr->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_60,expr);
      ReplaceWithBoundReference
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_60);
      this_00 = LogicalGet::GetColumnIds(get);
      make_uniq<duckdb::ExpressionFilter,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&local_68,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_60);
      pvVar2 = vector<duckdb::ColumnBinding,_true>::get<true>(&bindings,0);
      col_idx = vector<duckdb::ColumnIndex,_true>::get<true>(this_00,pvVar2->column_index);
      local_70._M_head_impl = local_68;
      local_68 = (TableFilter *)0x0;
      TableFilterSet::PushFilter
                (&get->table_filters,col_idx,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_70);
      if (local_70._M_head_impl != (TableFilter *)0x0) {
        (*(local_70._M_head_impl)->_vptr_TableFilter[1])();
      }
      local_70._M_head_impl = (TableFilter *)0x0;
      if (local_68 != (TableFilter *)0x0) {
        (*local_68->_vptr_TableFilter[1])();
      }
      if (local_60._M_head_impl != (Expression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      FVar4 = PUSHED_DOWN_FULLY;
    }
LAB_012580aa:
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                  &bindings);
  }
  return FVar4;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownGenericExpression(LogicalGet &get, Expression &expr) {
	if (!get.function.pushdown_expression) {
		// the scan does not support pushing down generic expressions
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	// extract the column bindings from this expression
	vector<ColumnBinding> bindings;
	ColumnLifetimeAnalyzer::ExtractColumnBindings(expr, bindings);
	if (bindings.empty()) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	// we can only pushdown expressions that refer to exactly one column
	for (idx_t i = 1; i < bindings.size(); i++) {
		if (bindings[i] != bindings[0]) {
			return FilterPushdownResult::NO_PUSHDOWN;
		}
	}
	if (!get.function.pushdown_expression(context, get, expr)) {
		// the scan does not support pushing down THIS expression
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	// replace the BoundColumnRefExpression with a BoundReference
	auto filter_expr = expr.Copy();
	ReplaceWithBoundReference(filter_expr);

	// push the expression filter
	auto &column_ids = get.GetColumnIds();
	auto expr_filter = make_uniq<ExpressionFilter>(std::move(filter_expr));
	auto &column_index = column_ids[bindings[0].column_index];
	get.table_filters.PushFilter(column_index, std::move(expr_filter));
	return FilterPushdownResult::PUSHED_DOWN_FULLY;
}